

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O2

void lore_append_spells(textblock *tb,monster_race *race,monster_lore *lore,bitflag *known_flags)

{
  bitflag *flags2;
  _Bool know_hp;
  undefined8 uVar1;
  monster_race *pmVar2;
  _Bool _Var3;
  _Bool _Var4;
  monster_sex_t mVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  char *in_R8;
  char *conjunction;
  char *in_R9;
  bitflag current_flags [12];
  bitflag test_flags [12];
  
  pmVar2 = ref_race;
  if (((tb == (textblock *)0x0) || (race == (monster_race *)0x0)) || (lore == (monster_lore *)0x0))
  {
    __assert_fail("tb && race && lore",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-lore.c"
                  ,0x5df,
                  "void lore_append_spells(textblock *, const struct monster_race *, const struct monster_lore *, bitflag *)"
                 );
  }
  know_hp = lore->armour_known;
  ref_race = race;
  mVar5 = lore_monster_sex(race);
  uVar1 = *(undefined8 *)(lore_pronoun_nominative_lore_pronouns + (ulong)mVar5 * 0x10 + 8);
  create_mon_spell_mask(current_flags,0x800,0);
  flags2 = lore->spell_flags;
  flag_inter(current_flags,flags2,0xc);
  create_mon_spell_mask(test_flags,4,0);
  flag_diff(current_flags,test_flags,0xc);
  _Var3 = flag_is_empty(current_flags,0xc);
  if (!_Var3) {
    textblock_append(tb,"%s may ",uVar1);
    lore_append_spell_clause(tb,current_flags,know_hp,race,in_R8,in_R9);
  }
  create_mon_spell_mask(current_flags,4,0);
  flag_inter(current_flags,flags2,0xc);
  _Var4 = flag_is_empty(current_flags,0xc);
  if (_Var4) {
    if (!_Var3) goto LAB_0016a249;
  }
  else {
    if (_Var3) {
      textblock_append(tb,"%s may ",uVar1);
    }
    else {
      textblock_append(tb,", and may ");
    }
    textblock_append_c(tb,'\f',"breathe ");
    lore_append_spell_clause(tb,current_flags,know_hp,race,in_R8,in_R9);
LAB_0016a249:
    if (race->freq_innate != L'\0') {
      if (lore->innate_freq_known == true) {
        textblock_append(tb,"; ");
        textblock_append_c(tb,'\r',"1");
        textblock_append(tb," time in ");
        uVar7 = (uint)(100 / (long)race->freq_innate);
LAB_0016a301:
        textblock_append_c(tb,'\r',"%d",(ulong)uVar7);
      }
      else if (lore->cast_innate != '\0') {
        iVar6 = race->freq_innate + L'\t';
        uVar7 = iVar6 - iVar6 % 10;
        uVar8 = (ulong)uVar7;
        if ((int)uVar7 < 2) {
          uVar8 = 1;
        }
        textblock_append(tb,"; about ");
        textblock_append_c(tb,'\r',"1");
        textblock_append(tb," time in ");
        uVar7 = (uint)(100 / uVar8);
        goto LAB_0016a301;
      }
      textblock_append(tb,".  ");
    }
  }
  flag_copy(current_flags,flags2,0xc);
  create_mon_spell_mask(test_flags,4,0x800,0);
  flag_diff(current_flags,test_flags,0xc);
  _Var3 = flag_is_empty(current_flags,0xc);
  if (_Var3) {
    ref_race = pmVar2;
    return;
  }
  textblock_append(tb,"%s may ",uVar1);
  textblock_append_c(tb,'\f',"cast spells");
  conjunction = "RF_SMART";
  _Var3 = flag_has_dbg(known_flags,0xb,0x1a,"known_flags","RF_SMART");
  if (_Var3) {
    textblock_append(tb," intelligently");
  }
  textblock_append(tb," which ");
  lore_append_spell_clause(tb,current_flags,know_hp,race,conjunction,in_R9);
  if (race->freq_spell != L'\0') {
    if (lore->spell_freq_known == true) {
      textblock_append(tb,"; ");
      textblock_append_c(tb,'\r',"1");
      textblock_append(tb," time in ");
      uVar7 = (uint)(100 / (long)race->freq_spell);
    }
    else {
      if (lore->cast_spell == '\0') goto LAB_0016a4c4;
      iVar6 = race->freq_spell + L'\t';
      uVar7 = iVar6 - iVar6 % 10;
      uVar8 = 1;
      if (1 < (int)uVar7) {
        uVar8 = (ulong)uVar7;
      }
      textblock_append(tb,"; about ");
      textblock_append_c(tb,'\r',"1");
      textblock_append(tb," time in ");
      uVar7 = (uint)(100 / uVar8);
    }
    textblock_append_c(tb,'\r',"%d",(ulong)uVar7);
  }
LAB_0016a4c4:
  textblock_append(tb,".  ");
  ref_race = pmVar2;
  return;
}

Assistant:

void lore_append_spells(textblock *tb, const struct monster_race *race,
						const struct monster_lore *lore,
						bitflag known_flags[RF_SIZE])
{
	monster_sex_t msex = MON_SEX_NEUTER;
	bool innate = false;
	bool breath = false;
	const char *initial_pronoun;
	bool know_hp;
	bitflag current_flags[RSF_SIZE], test_flags[RSF_SIZE];
	const struct monster_race *old_ref;

	assert(tb && race && lore);

	/* Set the race for expressions in the spells. */
	old_ref = ref_race;
	ref_race = race;

	know_hp = lore->armour_known;

	/* Extract a gender (if applicable) and get a pronoun for the start of
	 * sentences */
	msex = lore_monster_sex(race);
	initial_pronoun = lore_pronoun_nominative(msex, true);

	/* Collect innate (non-breath) attacks */
	create_mon_spell_mask(current_flags, RST_INNATE, RST_NONE);
	rsf_inter(current_flags, lore->spell_flags);
	create_mon_spell_mask(test_flags, RST_BREATH, RST_NONE);
	rsf_diff(current_flags, test_flags);
	if (!rsf_is_empty(current_flags)) {
		textblock_append(tb, "%s may ", initial_pronoun);
		lore_append_spell_clause(tb, current_flags, know_hp, race, "or", "");
		innate = true;
	}

	/* Collect breaths */
	create_mon_spell_mask(current_flags, RST_BREATH, RST_NONE);
	rsf_inter(current_flags, lore->spell_flags);
	if (!rsf_is_empty(current_flags)) {
		if (innate) {
			textblock_append(tb, ", and may ");
		} else {
			textblock_append(tb, "%s may ", initial_pronoun);
		}
		textblock_append_c(tb, COLOUR_L_RED, "breathe ");
		lore_append_spell_clause(tb, current_flags, know_hp, race, "or", "");
		breath = true;
	}

	/* End the sentence about innate spells and breaths */
	if ((innate || breath) && race->freq_innate) {
		if (lore->innate_freq_known) {
			/* Describe the spell frequency */
			textblock_append(tb, "; ");
			textblock_append_c(tb, COLOUR_L_GREEN, "1");
			textblock_append(tb, " time in ");
			textblock_append_c(tb, COLOUR_L_GREEN, "%d",
							   100 / race->freq_innate);
		} else if (lore->cast_innate) {
			/* Guess at the frequency */
			int approx_frequency = MAX(((race->freq_innate + 9) / 10) * 10, 1);
			textblock_append(tb, "; about ");
			textblock_append_c(tb, COLOUR_L_GREEN, "1");
			textblock_append(tb, " time in ");
			textblock_append_c(tb, COLOUR_L_GREEN, "%d",
							   100 / approx_frequency);
		}

		textblock_append(tb, ".  ");
	}

	/* Collect spell information */
	rsf_copy(current_flags, lore->spell_flags);
	create_mon_spell_mask(test_flags, RST_BREATH, RST_INNATE, RST_NONE);
	rsf_diff(current_flags, test_flags);
	if (!rsf_is_empty(current_flags)) {
		/* Intro */
		textblock_append(tb, "%s may ", initial_pronoun);

		/* Verb Phrase */
		textblock_append_c(tb, COLOUR_L_RED, "cast spells");

		/* Adverb */
		if (rf_has(known_flags, RF_SMART))
			textblock_append(tb, " intelligently");

		/* List */
		textblock_append(tb, " which ");
		lore_append_spell_clause(tb, current_flags, know_hp, race, "or", "");

		/* End the sentence about innate/other spells */
		if (race->freq_spell) {
			if (lore->spell_freq_known) {
				/* Describe the spell frequency */
				textblock_append(tb, "; ");
				textblock_append_c(tb, COLOUR_L_GREEN, "1");
				textblock_append(tb, " time in ");
				textblock_append_c(tb, COLOUR_L_GREEN, "%d",
								   100 / race->freq_spell);
			} else if (lore->cast_spell) {
				/* Guess at the frequency */
				int approx_frequency = MAX(((race->freq_spell + 9) / 10) * 10,
										   1);
				textblock_append(tb, "; about ");
				textblock_append_c(tb, COLOUR_L_GREEN, "1");
				textblock_append(tb, " time in ");
				textblock_append_c(tb, COLOUR_L_GREEN, "%d",
								   100 / approx_frequency);
			}
		}

		textblock_append(tb, ".  ");
	}

	/* Restore the previous reference. */
	ref_race = old_ref;
}